

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_clause_rewriter.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::InClauseRewriter::VisitReplace
          (InClauseRewriter *this,BoundOperatorExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  char cVar1;
  ClientContext *pCVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  long *plVar4;
  iterator __position;
  _func_int **pp_Var5;
  BaseExpression *pBVar6;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> _Var7;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> _Var8;
  _Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  _Var9;
  idx_t index;
  bool bVar10;
  int iVar11;
  reference pvVar12;
  pointer pEVar13;
  long lVar14;
  reference pvVar15;
  _Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false> _Var16;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> this_01;
  pointer pCVar17;
  type expr_00;
  LogicalComparisonJoin *this_02;
  pointer pLVar18;
  tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> this_03;
  LogicalFilter *pLVar19;
  pointer pLVar20;
  reference pvVar21;
  BoundOperatorExpression *this_04;
  pointer pBVar22;
  pointer pBVar23;
  BoundComparisonExpression *this_05;
  ulong uVar24;
  size_type sVar25;
  byte bVar26;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *pvVar27;
  size_type *this_06;
  ColumnBinding binding;
  initializer_list<duckdb::LogicalType> __l;
  templated_unique_single_t chunk_scan;
  idx_t chunk_index;
  vector<duckdb::LogicalType,_true> types;
  Value value;
  DataChunk chunk;
  ColumnDataAppendState append_state;
  LogicalType in_type;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> local_1b0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1a8;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_1a0;
  JoinCondition local_198;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_180;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_178;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_170;
  LogicalOperator *local_168;
  _Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false> local_160;
  _Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  local_158;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_150;
  Value local_138;
  DataChunk local_f8;
  ColumnDataAppendState local_b8;
  LogicalType local_60;
  LogicalType local_48;
  
  if (1 < (byte)(*(char *)&expr_ptr[1].
                           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                           .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl - 0x23U)
     ) {
    (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
  }
  pvVar27 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *)(expr_ptr + 0xb);
  local_1a8._M_head_impl = (Expression *)this;
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](pvVar27,0);
  pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar12);
  LogicalType::LogicalType(&local_60,&pEVar13->return_type);
  cVar1 = *(char *)&expr_ptr[1].
                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                    _M_t.
                    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  local_180 = pvVar27;
  if ((ulong)((long)expr_ptr[0xc].
                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                    _M_t.
                    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
             (long)expr_ptr[0xb].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl) < 9) {
LAB_0116dc7a:
    _Var16._M_head_impl = (BoundConjunctionExpression *)operator_new(0x70);
    BoundConjunctionExpression::BoundConjunctionExpression
              (_Var16._M_head_impl,cVar1 == '#' | CONJUNCTION_AND);
    local_138.type_._0_8_ = _Var16._M_head_impl;
    if (8 < (ulong)((long)expr_ptr[0xc].
                          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                          .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
                   (long)expr_ptr[0xb].
                         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)) {
      sVar25 = 1;
      do {
        pBVar23 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                                *)&local_138);
        pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](local_180,0);
        pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar12);
        (*(pEVar13->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_198,pEVar13);
        pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](local_180,sVar25);
        this_05 = (BoundComparisonExpression *)operator_new(0x68);
        local_b8.current_chunk_state.handles._M_h._M_buckets =
             (__buckets_ptr)
             local_198.left.
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        local_198.left.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        local_f8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pvVar12->
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BoundComparisonExpression::BoundComparisonExpression
                  (this_05,COMPARE_NOTEQUAL - (cVar1 == '#'),
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_b8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_f8);
        if (local_f8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)((long)((BaseExpression *)
                             &(local_f8.data.
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start)->vector_type)->
                             _vptr_BaseExpression + 8))();
        }
        local_f8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if ((Expression *)local_b8.current_chunk_state.handles._M_h._M_buckets != (Expression *)0x0)
        {
          (*((BaseExpression *)local_b8.current_chunk_state.handles._M_h._M_buckets)->
            _vptr_BaseExpression[1])();
        }
        local_150.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)this_05;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar23->children,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_150);
        if ((BoundComparisonExpression *)
            local_150.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start != (BoundComparisonExpression *)0x0) {
          (*(((Expression *)
             &(local_150.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start)->id_)->super_BaseExpression)._vptr_BaseExpression
            [1])();
        }
        local_150.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (local_198.left.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          (*((BaseExpression *)
            local_198.left.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->_vptr_BaseExpression
            [1])();
        }
        sVar25 = sVar25 + 1;
        _Var16._M_head_impl = (BoundConjunctionExpression *)local_138.type_._0_8_;
      } while (sVar25 < (ulong)((long)expr_ptr[0xc].
                                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                      .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                      _M_head_impl -
                                (long)expr_ptr[0xb].
                                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                      .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                      _M_head_impl >> 3));
    }
  }
  else {
    sVar25 = 1;
    bVar26 = 1;
    do {
      pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](pvVar27,sVar25);
      pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar12);
      iVar11 = (*(pEVar13->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar13);
      bVar26 = bVar26 & (byte)iVar11;
      lVar14 = (long)expr_ptr[0xc].
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                     _M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
               (long)expr_ptr[0xb].
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                     _M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      sVar25 = sVar25 + 1;
      uVar24 = lVar14 >> 3;
    } while (sVar25 < uVar24);
    if (lVar14 != 0x10) {
      if ((5 < uVar24 & bVar26) != 0) {
        LogicalType::LogicalType((LogicalType *)&local_b8,&local_60);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_b8;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_150,
                   __l,(allocator_type *)&local_f8);
        LogicalType::~LogicalType((LogicalType *)&local_b8);
        pCVar2 = *(ClientContext **)&(expr->super_Expression).super_BaseExpression.type;
        this_01._M_head_impl = (ColumnDataCollection *)operator_new(0x70);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_b8,
                   &local_150);
        ColumnDataCollection::ColumnDataCollection
                  (this_01._M_head_impl,pCVar2,(vector<duckdb::LogicalType,_true> *)&local_b8,
                   BUFFER_MANAGER_ALLOCATOR);
        local_158.super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)
             (_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)this_01._M_head_impl;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_b8);
        local_b8.current_chunk_state.handles._M_h._M_buckets =
             &local_b8.current_chunk_state.handles._M_h._M_single_bucket;
        local_b8.current_chunk_state.handles._M_h._M_bucket_count = (size_type)&DAT_00000001;
        local_b8.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_b8.current_chunk_state.handles._M_h._M_element_count = 0;
        local_b8.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_b8.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
        local_b8.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_b8.current_chunk_state.properties = INVALID;
        local_b8.vector_data.
        super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
        super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.vector_data.
        super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
        super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.vector_data.
        super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
        super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pCVar17 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                  ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                                *)&local_158);
        ColumnDataCollection::InitializeAppend(pCVar17,&local_b8);
        DataChunk::DataChunk(&local_f8);
        pvVar27 = local_180;
        DataChunk::Initialize
                  (&local_f8,*(ClientContext **)&(expr->super_Expression).super_BaseExpression.type,
                   (vector<duckdb::LogicalType,_true> *)&local_150,0x800);
        if (8 < (ulong)((long)expr_ptr[0xc].
                              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
                       (long)expr_ptr[0xb].
                             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                             .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)) {
          sVar25 = 1;
          do {
            LogicalType::LogicalType(&local_48,SQLNULL);
            Value::Value(&local_138,&local_48);
            LogicalType::~LogicalType(&local_48);
            pCVar2 = *(ClientContext **)&(expr->super_Expression).super_BaseExpression.type;
            pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[](local_180,sVar25);
            expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator*(pvVar12);
            bVar10 = ExpressionExecutor::TryEvaluateScalar(pCVar2,expr_00,&local_138);
            index = local_f8.count;
            if (!bVar10) {
              ((local_1a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
                   (_func_int **)0x0;
              Value::~Value(&local_138);
              goto LAB_0116de36;
            }
            local_f8.count = local_f8.count + 1;
            DataChunk::SetValue(&local_f8,0,index,&local_138);
            if ((local_f8.count == 0x800) ||
               (sVar25 + 1 ==
                (long)expr_ptr[0xc].
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
                (long)expr_ptr[0xb].
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl >> 3)) {
              pCVar17 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                        ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                                      *)&local_158);
              ColumnDataCollection::Append(pCVar17,&local_b8,&local_f8);
              DataChunk::Reset(&local_f8);
            }
            sVar25 = sVar25 + 1;
            Value::~Value(&local_138);
            pvVar27 = local_180;
          } while (sVar25 < (ulong)((long)expr_ptr[0xc].
                                          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                          .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                          _M_head_impl -
                                    (long)expr_ptr[0xb].
                                          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                          .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                          _M_head_impl >> 3));
        }
        local_160._M_head_impl =
             (BoundConjunctionExpression *)
             Binder::GenerateTableIndex
                       (*(Binder **)
                         ((expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p + 8))
        ;
        make_uniq<duckdb::LogicalColumnDataGet,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
                  ((duckdb *)&local_168,(unsigned_long *)&local_160,
                   (vector<duckdb::LogicalType,_true> *)&local_150,
                   (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                    *)&local_158);
        this_02 = (LogicalComparisonJoin *)operator_new(0x118);
        LogicalComparisonJoin::LogicalComparisonJoin(this_02,MARK,LOGICAL_COMPARISON_JOIN);
        _Var16._M_head_impl = local_160._M_head_impl;
        local_1a0._M_head_impl = this_02;
        pLVar18 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_1a0);
        (pLVar18->super_LogicalJoin).mark_index = (idx_t)_Var16._M_head_impl;
        pLVar18 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_1a0);
        local_170._M_head_impl =
             (LogicalOperator *)
             (expr->super_Expression).super_BaseExpression.alias.field_2._M_allocated_capacity;
        (expr->super_Expression).super_BaseExpression.alias.field_2._M_allocated_capacity = 0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar18,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_170);
        if (local_170._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_170._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        local_170._M_head_impl = (LogicalOperator *)0x0;
        pLVar18 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_1a0);
        local_178._M_head_impl = local_168;
        local_168 = (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar18,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_178);
        if (local_178._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_178._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        local_178._M_head_impl = (LogicalOperator *)0x0;
        local_198.left.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        local_198.right.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](pvVar27,0);
        _Var3._M_head_impl =
             (pvVar12->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        if ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
            local_198.left.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)0x0) {
          lVar14 = *(long *)local_198.left.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          local_198.left.
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               _Var3._M_head_impl;
          (**(code **)(lVar14 + 8))();
          _Var3._M_head_impl = (Expression *)local_198.left;
        }
        local_198.left.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             _Var3._M_head_impl;
        _Var16._M_head_impl = local_160._M_head_impl;
        this_03.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
             operator_new(0x70);
        LogicalType::LogicalType(&local_138.type_,&local_60);
        binding.column_index = 0;
        binding.table_index = (idx_t)_Var16._M_head_impl;
        BoundColumnRefExpression::BoundColumnRefExpression
                  ((BoundColumnRefExpression *)
                   this_03.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,&local_138.type_
                   ,binding,0);
        LogicalType::~LogicalType(&local_138.type_);
        if (local_198.right.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          pBVar6 = (BaseExpression *)
                   local_198.right.
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          local_198.right.
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               this_03.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (*pBVar6->_vptr_BaseExpression[1])();
          this_03.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
               (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
               local_198.right;
        }
        local_198.right.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             this_03.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        local_198.comparison = COMPARE_BOUNDARY_START;
        pLVar18 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_1a0);
        ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
        emplace_back<duckdb::JoinCondition>
                  (&(pLVar18->conditions).
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                   &local_198);
        _Var8._M_head_impl = local_1a0._M_head_impl;
        this_00 = &(expr->super_Expression).super_BaseExpression.alias.field_2;
        local_1a0._M_head_impl = (LogicalComparisonJoin *)0x0;
        plVar4 = (long *)this_00->_M_allocated_capacity;
        this_00->_M_allocated_capacity = (size_type)_Var8._M_head_impl;
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 8))();
        }
        this_06 = &(expr->super_Expression).super_BaseExpression.alias._M_string_length;
        optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
                  ((optional_ptr<duckdb::LogicalOperator,_true> *)this_06);
        if (*(char *)(*this_06 + 8) == '\x02') {
          optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
                    ((optional_ptr<duckdb::LogicalOperator,_true> *)this_06);
          pLVar19 = LogicalOperator::Cast<duckdb::LogicalFilter>((LogicalOperator *)*this_06);
          if ((pLVar19->projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (pLVar19->projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pLVar20 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                    *)&this_00->_M_allocated_capacity);
            (*pLVar20->_vptr_LogicalOperator[2])(&local_138);
            local_1b0._M_head_impl = (BoundOperatorExpression *)0x0;
            if (local_138.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)local_138.type_._0_8_) {
              do {
                pvVar21 = vector<duckdb::ColumnBinding,_true>::operator[]
                                    ((vector<duckdb::ColumnBinding,_true> *)&local_138,
                                     (size_type)local_1b0._M_head_impl);
                if ((BoundConjunctionExpression *)pvVar21->table_index != local_160._M_head_impl) {
                  __position._M_current =
                       (pLVar19->projection_map).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (pLVar19->projection_map).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                               &pLVar19->projection_map,__position,(unsigned_long *)&local_1b0);
                  }
                  else {
                    *__position._M_current = (unsigned_long)local_1b0._M_head_impl;
                    (pLVar19->projection_map).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish = __position._M_current + 1;
                  }
                }
                local_1b0._M_head_impl =
                     (BoundOperatorExpression *)
                     ((long)&((local_1b0._M_head_impl)->super_Expression).super_BaseExpression.
                             _vptr_BaseExpression + 1);
              } while (local_1b0._M_head_impl <
                       (BoundOperatorExpression *)
                       ((long)local_138.type_.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr - local_138.type_._0_8_ >> 4));
            }
            if ((_Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false>)local_138.type_._0_8_
                != (_Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false>)0x0) {
              operator_delete((void *)local_138.type_._0_8_);
            }
          }
        }
        local_138.type_._0_8_ = local_160._M_head_impl;
        local_138.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[9],duckdb::LogicalTypeId_const&,duckdb::ColumnBinding>
                  ((duckdb *)&local_1b0,(char (*) [9])"IN (...)",&LogicalType::BOOLEAN,
                   (ColumnBinding *)&local_138);
        ((local_1a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
             (_func_int **)local_1b0._M_head_impl;
        if (cVar1 != '#') {
          this_04 = (BoundOperatorExpression *)operator_new(0x70);
          LogicalType::LogicalType(&local_138.type_,BOOLEAN);
          BoundOperatorExpression::BoundOperatorExpression(this_04,OPERATOR_NOT,&local_138.type_);
          local_1b0._M_head_impl = this_04;
          LogicalType::~LogicalType(&local_138.type_);
          _Var3._M_head_impl = local_1a8._M_head_impl;
          pBVar22 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                                  *)&local_1b0);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pBVar22->children,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)_Var3._M_head_impl);
          _Var7._M_head_impl = local_1b0._M_head_impl;
          local_1b0._M_head_impl = (BoundOperatorExpression *)0x0;
          pp_Var5 = ((_Var3._M_head_impl)->super_BaseExpression)._vptr_BaseExpression;
          ((_Var3._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
               (_func_int **)_Var7._M_head_impl;
          if ((pp_Var5 != (_func_int **)0x0) &&
             ((**(code **)(*pp_Var5 + 8))(),
             local_1b0._M_head_impl != (BoundOperatorExpression *)0x0)) {
            (*((local_1b0._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
              [1])();
          }
        }
        if (local_198.right.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          (*(((Expression *)
             local_198.right.
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->super_BaseExpression)
            ._vptr_BaseExpression[1])();
        }
        local_198.right.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        if (local_198.left.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          (*((BaseExpression *)
            local_198.left.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->_vptr_BaseExpression
            [1])();
        }
        if (local_1a0._M_head_impl != (LogicalComparisonJoin *)0x0) {
          (*((local_1a0._M_head_impl)->super_LogicalJoin).super_LogicalOperator.
            _vptr_LogicalOperator[1])();
        }
        if (local_168 != (LogicalOperator *)0x0) {
          (*local_168->_vptr_LogicalOperator[1])();
        }
LAB_0116de36:
        DataChunk::~DataChunk(&local_f8);
        ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
        ~vector(&local_b8.vector_data.
                 super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
               );
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_b8);
        _Var9.super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
             local_158.super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl;
        if (local_158.super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl !=
            (ColumnDataCollection *)0x0) {
          ColumnDataCollection::~ColumnDataCollection
                    ((ColumnDataCollection *)
                     local_158.super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>.
                     _M_head_impl);
          operator_delete((void *)_Var9.super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>
                                  ._M_head_impl);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_150);
        goto LAB_0116ddf6;
      }
      goto LAB_0116dc7a;
    }
    pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](pvVar27,0);
    pvVar15 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](pvVar27,1);
    _Var16._M_head_impl = (BoundConjunctionExpression *)operator_new(0x68);
    local_b8.current_chunk_state.handles._M_h._M_buckets =
         (__buckets_ptr)
         (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    local_f8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(pvVar15->
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                  _M_t.
                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar15->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundComparisonExpression::BoundComparisonExpression
              ((BoundComparisonExpression *)_Var16._M_head_impl,COMPARE_NOTEQUAL - (cVar1 == '#'),
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_b8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_f8);
    if (local_f8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)((BaseExpression *)
                         &(local_f8.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_start)->vector_type)->
                         _vptr_BaseExpression + 8))();
    }
    local_f8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if ((Expression *)local_b8.current_chunk_state.handles._M_h._M_buckets != (Expression *)0x0) {
      (*((BaseExpression *)local_b8.current_chunk_state.handles._M_h._M_buckets)->
        _vptr_BaseExpression[1])();
    }
  }
  ((local_1a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
       (_func_int **)_Var16._M_head_impl;
LAB_0116ddf6:
  LogicalType::~LogicalType(&local_60);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_1a8._M_head_impl;
}

Assistant:

unique_ptr<Expression> InClauseRewriter::VisitReplace(BoundOperatorExpression &expr, unique_ptr<Expression> *expr_ptr) {
	if (expr.GetExpressionType() != ExpressionType::COMPARE_IN &&
	    expr.GetExpressionType() != ExpressionType::COMPARE_NOT_IN) {
		return nullptr;
	}
	D_ASSERT(root);
	auto in_type = expr.children[0]->return_type;
	bool is_regular_in = expr.GetExpressionType() == ExpressionType::COMPARE_IN;
	bool all_scalar = true;
	// IN clause with many children: try to generate a mark join that replaces this IN expression
	// we can only do this if the expressions in the expression list are scalar
	for (idx_t i = 1; i < expr.children.size(); i++) {
		if (!expr.children[i]->IsFoldable()) {
			// non-scalar expression
			all_scalar = false;
		}
	}
	if (expr.children.size() == 2) {
		// only one child
		// IN: turn into X = 1
		// NOT IN: turn into X <> 1
		return make_uniq<BoundComparisonExpression>(is_regular_in ? ExpressionType::COMPARE_EQUAL
		                                                          : ExpressionType::COMPARE_NOTEQUAL,
		                                            std::move(expr.children[0]), std::move(expr.children[1]));
	}
	if (expr.children.size() < 6 || !all_scalar) {
		// low amount of children or not all scalar
		// IN: turn into (X = 1 OR X = 2 OR X = 3...)
		// NOT IN: turn into (X <> 1 AND X <> 2 AND X <> 3 ...)
		auto conjunction = make_uniq<BoundConjunctionExpression>(is_regular_in ? ExpressionType::CONJUNCTION_OR
		                                                                       : ExpressionType::CONJUNCTION_AND);
		for (idx_t i = 1; i < expr.children.size(); i++) {
			conjunction->children.push_back(make_uniq<BoundComparisonExpression>(
			    is_regular_in ? ExpressionType::COMPARE_EQUAL : ExpressionType::COMPARE_NOTEQUAL,
			    expr.children[0]->Copy(), std::move(expr.children[i])));
		}
		return std::move(conjunction);
	}
	// IN clause with many constant children
	// generate a mark join that replaces this IN expression
	// first generate a ColumnDataCollection from the set of expressions
	vector<LogicalType> types = {in_type};
	auto collection = make_uniq<ColumnDataCollection>(context, types);
	ColumnDataAppendState append_state;
	collection->InitializeAppend(append_state);

	DataChunk chunk;
	chunk.Initialize(context, types);
	for (idx_t i = 1; i < expr.children.size(); i++) {
		// resolve this expression to a constant
		Value value;
		if (!ExpressionExecutor::TryEvaluateScalar(context, *expr.children[i], value)) {
			// error while evaluating scalar
			return nullptr;
		}
		idx_t index = chunk.size();
		chunk.SetCardinality(chunk.size() + 1);
		chunk.SetValue(0, index, value);
		if (chunk.size() == STANDARD_VECTOR_SIZE || i + 1 == expr.children.size()) {
			// chunk full: append to chunk collection
			collection->Append(append_state, chunk);
			chunk.Reset();
		}
	}
	// now generate a ChunkGet that scans this collection
	auto chunk_index = optimizer.binder.GenerateTableIndex();
	auto chunk_scan = make_uniq<LogicalColumnDataGet>(chunk_index, types, std::move(collection));

	// then we generate the MARK join with the chunk scan on the RHS
	auto join = make_uniq<LogicalComparisonJoin>(JoinType::MARK);
	join->mark_index = chunk_index;
	join->AddChild(std::move(root));
	join->AddChild(std::move(chunk_scan));
	// create the JOIN condition
	JoinCondition cond;
	cond.left = std::move(expr.children[0]);

	cond.right = make_uniq<BoundColumnRefExpression>(in_type, ColumnBinding(chunk_index, 0));
	cond.comparison = ExpressionType::COMPARE_EQUAL;
	join->conditions.push_back(std::move(cond));
	root = std::move(join);

	if (current_op->type == LogicalOperatorType::LOGICAL_FILTER) {
		// project out the mark index again
		auto &filter = current_op->Cast<LogicalFilter>();
		if (filter.projection_map.empty()) {
			auto child_bindings = root->GetColumnBindings();
			for (idx_t i = 0; i < child_bindings.size(); i++) {
				if (child_bindings[i].table_index != chunk_index) {
					filter.projection_map.push_back(i);
				}
			}
		}
	}

	// we replace the original subquery with a BoundColumnRefExpression referring to the mark column
	unique_ptr<Expression> result =
	    make_uniq<BoundColumnRefExpression>("IN (...)", LogicalType::BOOLEAN, ColumnBinding(chunk_index, 0));
	if (!is_regular_in) {
		// NOT IN: invert
		auto invert = make_uniq<BoundOperatorExpression>(ExpressionType::OPERATOR_NOT, LogicalType::BOOLEAN);
		invert->children.push_back(std::move(result));
		result = std::move(invert);
	}
	return result;
}